

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpt_helper.c
# Opt level: O2

void breakpoint_handler_x86_64(CPUState *cs)

{
  CPUX86State *env;
  CPUBreakpoint *pCVar1;
  _Bool _Var2;
  anon_union_16_2_aaf24f3d_for_entry *paVar3;
  
  env = (CPUX86State *)(cs[1].tb_jmp_cache + 0xeb);
  if (cs->watchpoint_hit == (CPUWatchpoint *)0x0) {
    paVar3 = (anon_union_16_2_aaf24f3d_for_entry *)&cs->breakpoints;
    while (pCVar1 = paVar3->tqe_next, pCVar1 != (CPUBreakpoint *)0x0) {
      if ((TranslationBlock *)pCVar1->pc == cs[1].tb_jmp_cache[0xfb]) {
        if ((pCVar1->flags & 0x20) == 0) {
          return;
        }
        check_hw_breakpoints(env,true);
        raise_exception_x86_64(env,1);
      }
      paVar3 = &pCVar1->entry;
    }
  }
  else if ((cs->watchpoint_hit->flags & 0x20) != 0) {
    cs->watchpoint_hit = (CPUWatchpoint *)0x0;
    _Var2 = check_hw_breakpoints(env,false);
    if (!_Var2) {
      cpu_loop_exit_noexc_x86_64(cs);
    }
    raise_exception_x86_64(env,1);
  }
  return;
}

Assistant:

void breakpoint_handler(CPUState *cs)
{
    X86CPU *cpu = X86_CPU(cs);
    CPUX86State *env = &cpu->env;
    CPUBreakpoint *bp;

    if (cs->watchpoint_hit) {
        if (cs->watchpoint_hit->flags & BP_CPU) {
            cs->watchpoint_hit = NULL;
            if (check_hw_breakpoints(env, false)) {
                raise_exception(env, EXCP01_DB);
            } else {
                cpu_loop_exit_noexc(cs);
            }
        }
    } else {
        QTAILQ_FOREACH(bp, &cs->breakpoints, entry) {
            if (bp->pc == env->eip) {
                if (bp->flags & BP_CPU) {
                    check_hw_breakpoints(env, true);
                    raise_exception(env, EXCP01_DB);
                }
                break;
            }
        }
    }
}